

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O2

void __thiscall
PathEscapingSensiblePathsAreNotNeedlesslyEscaped::~PathEscapingSensiblePathsAreNotNeedlesslyEscaped
          (PathEscapingSensiblePathsAreNotNeedlesslyEscaped *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PathEscaping, SensiblePathsAreNotNeedlesslyEscaped) {
  const char* path = "some/sensible/path/without/crazy/characters.c++";
  string result;

  GetWin32EscapedString(path, &result);
  EXPECT_EQ(path, result);
  result.clear();

  GetShellEscapedString(path, &result);
  EXPECT_EQ(path, result);
}